

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraEclipseCDT4Generator.cxx
# Opt level: O1

void cmExtraEclipseCDT4Generator::AppendScannerProfile
               (cmGeneratedFileStream *fout,string *profileID,bool openActionEnabled,
               string *openActionFilePath,bool pParserEnabled,string *scannerInfoProviderID,
               string *runActionArguments,string *runActionCommand,bool runActionUseDefault,
               bool sipParserEnabled)

{
  ostream *poVar1;
  undefined7 in_register_00000011;
  char *pcVar2;
  char *pcVar3;
  undefined3 in_register_00000081;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)fout,"<profile id=\"",0xd);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)fout,(profileID->_M_dataplus)._M_p,profileID->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"\">\n<buildOutputProvider>\n<openAction enabled=\"",0x2e);
  pcVar2 = "false";
  pcVar3 = "false";
  if ((int)CONCAT71(in_register_00000011,openActionEnabled) != 0) {
    pcVar3 = "true";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,pcVar3,CONCAT71(in_register_00000011,openActionEnabled) & 0xffffffff ^ 5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\" filePath=\"",0xc);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(openActionFilePath->_M_dataplus)._M_p,
                      openActionFilePath->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\"/>\n<parser enabled=\"",0x15);
  pcVar3 = "false";
  if (CONCAT31(in_register_00000081,pParserEnabled) != 0) {
    pcVar3 = "true";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,pcVar3,(ulong)CONCAT31(in_register_00000081,pParserEnabled) ^ 5);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"\"/>\n</buildOutputProvider>\n<scannerInfoProvider id=\"",0x34);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(scannerInfoProviderID->_M_dataplus)._M_p,
                      scannerInfoProviderID->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\">\n<runAction arguments=\"",0x19);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(runActionArguments->_M_dataplus)._M_p,
                      runActionArguments->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\" command=\"",0xb);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(runActionCommand->_M_dataplus)._M_p,runActionCommand->_M_string_length
                     );
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\" useDefault=\"",0xe);
  pcVar3 = "false";
  if (runActionUseDefault) {
    pcVar3 = "true";
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,pcVar3,(ulong)runActionUseDefault ^ 5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\"/>\n<parser enabled=\"",0x15);
  if (sipParserEnabled) {
    pcVar2 = "true";
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,pcVar2,(ulong)sipParserEnabled ^ 5);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"\"/>\n</scannerInfoProvider>\n</profile>\n",0x26);
  return;
}

Assistant:

void cmExtraEclipseCDT4Generator
::AppendScannerProfile(cmGeneratedFileStream& fout,
                       const std::string&     profileID,
                       bool                   openActionEnabled,
                       const std::string&     openActionFilePath,
                       bool                   pParserEnabled,
                       const std::string&     scannerInfoProviderID,
                       const std::string&     runActionArguments,
                       const std::string&     runActionCommand,
                       bool                   runActionUseDefault,
                       bool                   sipParserEnabled)
{
  fout <<
    "<profile id=\"" << profileID << "\">\n"
    "<buildOutputProvider>\n"
    "<openAction enabled=\"" << (openActionEnabled ? "true" : "false")
    << "\" filePath=\"" << openActionFilePath << "\"/>\n"
    "<parser enabled=\"" << (pParserEnabled ? "true" : "false") << "\"/>\n"
    "</buildOutputProvider>\n"
    "<scannerInfoProvider id=\"" << scannerInfoProviderID << "\">\n"
    "<runAction arguments=\"" << runActionArguments << "\""
    " command=\"" << runActionCommand
    << "\" useDefault=\"" << (runActionUseDefault ? "true":"false") << "\"/>\n"
    "<parser enabled=\"" << (sipParserEnabled ? "true" : "false") << "\"/>\n"
    "</scannerInfoProvider>\n"
    "</profile>\n"
    ;
}